

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

menu * menu_new_action(menu_action *acts,size_t n)

{
  menu *m;
  
  m = (menu *)mem_alloc(0xb0);
  memset(m,0,0xb0);
  m->row_funcs = &menu_iter_actions;
  m->skin = &menu_skin_scroll;
  m->cursor = 0;
  m->cursor_x_offset = 0;
  m->count = (int)n;
  m->menu_data = acts;
  menu_ensure_cursor_valid(m);
  return m;
}

Assistant:

struct menu *menu_new_action(menu_action *acts, size_t n)
{
	struct menu *m = menu_new(MN_SKIN_SCROLL, menu_find_iter(MN_ITER_ACTIONS));
	menu_setpriv(m, n, acts);
	return m;
}